

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O0

Array2D<unsigned_int> * __thiscall WFC::wave_to_output(WFC *this)

{
  bool bVar1;
  reference pvVar2;
  size_t in_RSI;
  Array2D<unsigned_int> *in_RDI;
  uint k;
  uint i;
  Array2D<unsigned_int> *output_patterns;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  Array2D<unsigned_int> *pAVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  value_type vVar4;
  value_type vVar5;
  uint local_18;
  
  pAVar3 = in_RDI;
  Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_RSI,(size_t)in_RDI);
  for (local_18 = 0; local_18 < *(uint *)(in_RSI + 0x110); local_18 = local_18 + 1) {
    for (vVar4 = 0; (ulong)vVar4 < *(ulong *)(in_RSI + 0x118); vVar4 = vVar4 + 1) {
      bVar1 = Wave::get((Wave *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      if (bVar1) {
        vVar5 = vVar4;
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->data,(ulong)local_18);
        *pvVar2 = vVar4;
        in_stack_ffffffffffffffc4 = vVar4;
        vVar4 = vVar5;
      }
    }
  }
  return pAVar3;
}

Assistant:

Array2D<unsigned> WFC::wave_to_output() const noexcept {
  Array2D<unsigned> output_patterns(wave.height, wave.width);
  for (unsigned i = 0; i < wave.size; i++) {
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(i, k)) {
        output_patterns.data[i] = k;
      }
    }
  }
  return output_patterns;
}